

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O0

void __thiscall amrex::AmrLevel::postCoarseTimeStep(AmrLevel *this,Real time)

{
  int iVar1;
  AmrLevel *this_00;
  Long LVar2;
  long in_RDI;
  int i;
  AmrLevel *amrlevel;
  int lev;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  Amr *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 local_14;
  
  local_14 = 0;
  while( true ) {
    iVar1 = AmrMesh::finestLevel(*(AmrMesh **)(in_RDI + 0x150));
    if (iVar1 < local_14) break;
    this_00 = Amr::getLevel(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    iVar1 = 0;
    while( true ) {
      in_stack_ffffffffffffffc0 = (Amr *)(long)iVar1;
      LVar2 = Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::size
                        ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)0x1392fb5);
      if (LVar2 <= (long)in_stack_ffffffffffffffc0) break;
      Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
                ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                 in_stack_ffffffffffffffc0,
                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      StateData::syncNewTimeLevel
                ((StateData *)this_00,(Real)CONCAT44(iVar1,in_stack_ffffffffffffffd8));
      iVar1 = iVar1 + 1;
    }
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void
AmrLevel::postCoarseTimeStep (Real time)
{
    BL_ASSERT(level == 0);
    // sync up statedata time
    for (int lev = 0; lev <= parent->finestLevel(); ++lev) {
        AmrLevel& amrlevel = parent->getLevel(lev);
        for (int i = 0; i < amrlevel.state.size(); ++i) {
            amrlevel.state[i].syncNewTimeLevel(time);
        }
    }
}